

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WScriptJsrt.cpp
# Opt level: O0

JsValueRef
WScriptJsrt::GetReportCallback
          (JsValueRef callee,bool isConstructCall,JsValueRef *arguments,unsigned_short argumentCount
          ,void *callbackState)

{
  JsErrorCode JVar1;
  RuntimeThreadLocalData *pRVar2;
  size_type sVar3;
  reference pvVar4;
  char *content;
  size_t length;
  string local_70 [8];
  value_type str;
  RuntimeThreadData **threadData;
  JsValueRef pvStack_40;
  JsErrorCode errorCode;
  JsValueRef returnValue;
  void *pvStack_30;
  HRESULT hr;
  void *callbackState_local;
  JsValueRef *ppvStack_20;
  unsigned_short argumentCount_local;
  JsValueRef *arguments_local;
  JsValueRef pvStack_10;
  bool isConstructCall_local;
  JsValueRef callee_local;
  
  returnValue._4_4_ = 0x80004005;
  pvStack_40 = (JsValueRef)0x0;
  pvStack_30 = callbackState;
  callbackState_local._6_2_ = argumentCount;
  ppvStack_20 = arguments;
  arguments_local._7_1_ = isConstructCall;
  pvStack_10 = callee;
  JVar1 = ChakraRTInterface::JsGetNullValue(&stack0xffffffffffffffc0);
  if (((JVar1 == JsNoError) && (callbackState_local._6_2_ != 0)) &&
     (pRVar2 = GetRuntimeThreadLocalData(), pRVar2->threadData != (RuntimeThreadData *)0x0)) {
    EnterCriticalSection(&pRVar2->threadData->csReportQ);
    sVar3 = std::__cxx11::
            list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&pRVar2->threadData->reportQ);
    if (sVar3 != 0) {
      pvVar4 = std::__cxx11::
               list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::front(&pRVar2->threadData->reportQ);
      std::__cxx11::string::string(local_70,(string *)pvVar4);
      std::__cxx11::
      list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::pop_front(&pRVar2->threadData->reportQ);
      content = (char *)std::__cxx11::string::c_str();
      length = std::__cxx11::string::size();
      ChakraRTInterface::JsCreateString(content,length,&stack0xffffffffffffffc0);
      std::__cxx11::string::~string(local_70);
    }
    LeaveCriticalSection(&pRVar2->threadData->csReportQ);
  }
  return pvStack_40;
}

Assistant:

JsValueRef __stdcall WScriptJsrt::GetReportCallback(JsValueRef callee, bool isConstructCall, JsValueRef *arguments, unsigned short argumentCount, void *callbackState)
{
    HRESULT hr = E_FAIL;
    JsValueRef returnValue = JS_INVALID_REFERENCE;
    JsErrorCode errorCode = JsNoError;

    IfJsrtErrorSetGo(ChakraRTInterface::JsGetNullValue(&returnValue));

    if (argumentCount > 0)
    {
        auto& threadData = GetRuntimeThreadLocalData().threadData;
        if (threadData)
        {
            EnterCriticalSection(&threadData->csReportQ);

            if (threadData->reportQ.size() > 0)
            {
                auto str = threadData->reportQ.front();
                threadData->reportQ.pop_front();
                ChakraRTInterface::JsCreateString(str.c_str(), str.size(), &returnValue);
            }
            LeaveCriticalSection(&threadData->csReportQ);
        }
    }

Error:
    return returnValue;
}